

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DetectorManager.cpp
# Opt level: O2

unique_ptr<DetectorManager,_std::default_delete<DetectorManager>_> DetectorManager::create(void)

{
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>_>_>
  *this;
  __uniq_ptr_data<DetectorManager,_std::default_delete<DetectorManager>,_true,_true> in_RDI;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>_>
  __l;
  allocator_type local_82;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_81;
  shared_ptr<DetectorManager::DetectorLauncher<Yolact>_> local_80;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>
  local_70;
  DetectorMap_t detectors;
  
  std::make_shared<DetectorManager::DetectorLauncher<Yolact>>();
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>
  ::pair<const_char_(&)[7],_std::shared_ptr<DetectorManager::DetectorLauncher<Yolact>_>,_true>
            (&local_70,(char (*) [7])"yolact",&local_80);
  __l._M_len = 1;
  __l._M_array = &local_70;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>_>_>
  ::map(&detectors,__l,&local_81,&local_82);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>
  ::~pair(&local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_80.
              super___shared_ptr<DetectorManager::DetectorLauncher<Yolact>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  this = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>_>_>
          *)operator_new(0x30);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>_>_>
  ::_Rb_tree(this,&detectors._M_t);
  *(_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>_>_>
    **)in_RDI.super___uniq_ptr_impl<DetectorManager,_std::default_delete<DetectorManager>_>._M_t.
       super__Tuple_impl<0UL,_DetectorManager_*,_std::default_delete<DetectorManager>_>.
       super__Head_base<0UL,_DetectorManager_*,_false>._M_head_impl = this;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<DetectorManager::DetectorLauncherInterface>_>_>_>
  ::~_Rb_tree(&detectors._M_t);
  return (__uniq_ptr_data<DetectorManager,_std::default_delete<DetectorManager>,_true,_true>)
         (tuple<DetectorManager_*,_std::default_delete<DetectorManager>_>)
         in_RDI.super___uniq_ptr_impl<DetectorManager,_std::default_delete<DetectorManager>_>._M_t.
         super__Tuple_impl<0UL,_DetectorManager_*,_std::default_delete<DetectorManager>_>.
         super__Head_base<0UL,_DetectorManager_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<DetectorManager> DetectorManager::create() 
{
	DetectorMap_t detectors = 
	{
		{"yolact", std::make_shared<DetectorLauncher<Yolact>>()},
	};

	auto mgt = new DetectorManager(detectors);
	if (!mgt) 
	{
		return nullptr;
	}

	return std::unique_ptr<DetectorManager>(std::move(mgt));
}